

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O3

uint32_t do_helper_clc(CPUS390XState_conflict *env,uint32_t l,uint64_t s1,uint64_t s2,uintptr_t ra)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  uint32_t uVar6;
  uint uVar7;
  
  uVar6 = 0;
  uVar7 = 1;
  do {
    uVar2 = cpu_ldub_data_ra_s390x(env,(uVar7 - 1) + s1,ra);
    uVar3 = cpu_ldub_data_ra_s390x(env,(uVar7 - 1) + s2,ra);
    uVar5 = uVar2 & 0xff;
    uVar4 = uVar3 & 0xff;
    if (uVar5 >= uVar4 && uVar5 != uVar4) {
      uVar6 = 2;
    }
    if (uVar5 < uVar4) {
      uVar6 = 1;
    }
  } while ((uVar5 == uVar4) && (bVar1 = uVar7 <= l, uVar7 = uVar7 + 1, bVar1));
  return uVar6;
}

Assistant:

static uint32_t do_helper_clc(CPUS390XState *env, uint32_t l, uint64_t s1,
                              uint64_t s2, uintptr_t ra)
{
    uint32_t i;
    uint32_t cc = 0;

    HELPER_LOG("%s l %d s1 %" PRIx64 " s2 %" PRIx64 "\n",
               __func__, l, s1, s2);

    for (i = 0; i <= l; i++) {
        uint8_t x = cpu_ldub_data_ra(env, s1 + i, ra);
        uint8_t y = cpu_ldub_data_ra(env, s2 + i, ra);
        HELPER_LOG("%02x (%c)/%02x (%c) ", x, x, y, y);
        if (x < y) {
            cc = 1;
            break;
        } else if (x > y) {
            cc = 2;
            break;
        }
    }

    HELPER_LOG("\n");
    return cc;
}